

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void charls::transform_line<charls::transform_hp1<unsigned_short>,unsigned_short>
               (triplet<unsigned_short> *destination,triplet<unsigned_short> *source,
               size_t pixel_count,transform_hp1<unsigned_short> *transform,uint32_t mask)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  
  if (pixel_count != 0) {
    lVar2 = 0;
    do {
      uVar1 = *(ushort *)((long)&source->field_0 + lVar2);
      uVar3 = *(ushort *)((long)&source->field_1 + lVar2) & mask;
      *(ushort *)((long)&destination->field_2 + lVar2) =
           (*(ushort *)((long)&source->field_2 + lVar2) & (ushort)mask) - (short)uVar3 ^ 0x8000;
      *(uint *)((long)&destination->field_0 + lVar2) =
           ((uVar1 & mask) - uVar3 ^ 0x8000) & 0xffff | uVar3 << 0x10;
      lVar2 = lVar2 + 6;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask);
    }
}